

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Forel.cpp
# Opt level: O0

void __thiscall Forel::print_clusters(Forel *this,ofstream *out,string *filename)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  char cVar11;
  Point g_2;
  int i_2;
  int j;
  Cluster g_1;
  undefined1 local_7c8 [4];
  int i_1;
  vector<double,_std::allocator<double>_> values;
  Point p;
  Cluster g;
  int i;
  int c;
  int b;
  int a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  undefined1 local_6d0 [8];
  string filename_forel;
  undefined1 local_690 [8];
  string filename_gnu;
  undefined1 local_650 [8];
  string arrow_name;
  ofstream out_forel;
  ostream local_420 [8];
  ofstream out_arrow;
  ostream local_220 [8];
  ofstream out_gnu;
  string *filename_local;
  ofstream *out_local;
  Forel *this_local;
  
  std::ofstream::ofstream(local_220);
  std::ofstream::ofstream(local_420);
  std::ofstream::ofstream((void *)((long)&arrow_name.field_2 + 8));
  cVar11 = (char)filename;
  std::__cxx11::string::find_last_of(cVar11,0x2e);
  std::__cxx11::string::substr((ulong)((long)&filename_gnu.field_2 + 8),(ulong)filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&filename_gnu.field_2 + 8),"_arrow");
  std::__cxx11::string::~string((string *)(filename_gnu.field_2._M_local_buf + 8));
  std::__cxx11::string::find_last_of(cVar11,0x2e);
  std::__cxx11::string::substr((ulong)((long)&filename_forel.field_2 + 8),(ulong)filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_690,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&filename_forel.field_2 + 8),"_gnu.plt");
  std::__cxx11::string::~string((string *)(filename_forel.field_2._M_local_buf + 8));
  std::__cxx11::string::find_last_of(cVar11,0x2e);
  std::__cxx11::string::substr((ulong)&local_6f0,(ulong)filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0,
                 &local_6f0,"circle_centres");
  std::__cxx11::string::~string((string *)&local_6f0);
  std::ofstream::open(local_220,local_690,0x10);
  std::ofstream::open(local_420,local_650,0x10);
  std::ofstream::open((undefined1 *)((long)&arrow_name.field_2 + 8),local_6d0,0x10);
  poVar6 = std::operator<<(local_220,"rgb(r,g,b) = 65536 * int(r) + 256 * int(g) + int(b)");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::operator+(&local_730,"plot \'/Users/AlinaArslanova/untitled1/cmake-build-debug/",filename);
  std::operator+(&local_710,&local_730,
                 "\' using 1:2:(rgb($3,$4,$5))  notitle with points lc rgb variable,");
  poVar6 = std::operator<<(local_220,(string *)&local_710);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b,
                 " \'/Users/AlinaArslanova/untitled1/cmake-build-debug/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0);
  std::operator+(&local_750,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b,
                 "\' with circles");
  std::operator<<(poVar6,(string *)&local_750);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_730);
  std::ofstream::open(out,filename,0x10);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Errors in opening");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 0;
    while( true ) {
      sVar7 = std::vector<Cluster,_std::allocator<Cluster>_>::size(&this->clusters);
      if ((int)sVar7 <=
          (int)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) break;
      pvVar8 = std::vector<Cluster,_std::allocator<Cluster>_>::operator[]
                         (&this->clusters,
                          (long)(int)g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar7 = std::vector<Point,_std::allocator<Point>_>::size(&pvVar8->points);
      if (10 < sVar7) {
        pvVar8 = std::vector<Cluster,_std::allocator<Cluster>_>::operator[]
                           (&this->clusters,
                            (long)(int)g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
        Cluster::Cluster((Cluster *)&p.y,pvVar8);
        Cluster::find_mass_centre
                  ((Point *)&values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(Cluster *)&p.y);
        Cluster::find_vectors((vector<double,_std::allocator<double>_> *)local_7c8,(Cluster *)&p.y);
        poVar6 = (ostream *)std::ostream::operator<<(local_420,p.eps);
        poVar6 = std::operator<<(poVar6," ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,p.x);
        poVar6 = std::operator<<(poVar6," ");
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_7c8,0);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar9);
        poVar6 = std::operator<<(poVar6," ");
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_7c8,1);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar9);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = (ostream *)std::ostream::operator<<(local_420,p.eps);
        poVar6 = std::operator<<(poVar6," ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,p.x);
        poVar6 = std::operator<<(poVar6," ");
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_7c8,2);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar9);
        poVar6 = std::operator<<(poVar6," ");
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_7c8,3);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar9);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_7c8);
        Cluster::~Cluster((Cluster *)&p.y);
      }
      g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1;
    }
    g_1.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    while( true ) {
      iVar3 = g_1.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      sVar7 = std::vector<Cluster,_std::allocator<Cluster>_>::size(&this->clusters);
      if ((int)sVar7 <= iVar3) break;
      iVar3 = rand();
      iVar4 = rand();
      iVar5 = rand();
      pvVar8 = std::vector<Cluster,_std::allocator<Cluster>_>::operator[]
                         (&this->clusters,
                          (long)g_1.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage._4_4_);
      Cluster::Cluster((Cluster *)&i_2,pvVar8);
      g_2.y._4_4_ = 0;
      while( true ) {
        sVar7 = std::vector<Point,_std::allocator<Point>_>::size
                          ((vector<Point,_std::allocator<Point>_> *)&i_2);
        if ((int)sVar7 <= g_2.y._4_4_) break;
        pvVar10 = std::vector<Point,_std::allocator<Point>_>::operator[]
                            ((vector<Point,_std::allocator<Point>_> *)&i_2,(long)g_2.y._4_4_);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)out,pvVar10->x);
        poVar6 = std::operator<<(poVar6," ");
        pvVar10 = std::vector<Point,_std::allocator<Point>_>::operator[]
                            ((vector<Point,_std::allocator<Point>_> *)&i_2,(long)g_2.y._4_4_);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar10->y);
        poVar6 = std::operator<<(poVar6," ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3 % 0x101);
        poVar6 = std::operator<<(poVar6," ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4 % 0x101);
        poVar6 = std::operator<<(poVar6," ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5 % 0x101);
        poVar6 = std::operator<<(poVar6," ");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        g_2.y._4_4_ = g_2.y._4_4_ + 1;
      }
      Cluster::~Cluster((Cluster *)&i_2);
      g_1.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           g_1.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
    g_2.y._0_4_ = 0;
    while( true ) {
      sVar7 = std::vector<Point,_std::allocator<Point>_>::size(&this->forel_circles);
      if ((int)sVar7 <= g_2.y._0_4_) break;
      pvVar10 = std::vector<Point,_std::allocator<Point>_>::operator[]
                          (&this->forel_circles,(long)g_2.y._0_4_);
      dVar1 = pvVar10->y;
      poVar6 = (ostream *)
               std::ostream::operator<<((ostream *)(arrow_name.field_2._M_local_buf + 8),pvVar10->x)
      ;
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar1);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->forel_r);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      g_2.y._0_4_ = g_2.y._0_4_ + 1;
    }
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
  }
  std::__cxx11::string::~string((string *)local_6d0);
  std::__cxx11::string::~string((string *)local_690);
  std::__cxx11::string::~string((string *)local_650);
  std::ofstream::~ofstream((void *)((long)&arrow_name.field_2 + 8));
  std::ofstream::~ofstream(local_420);
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void Forel::print_clusters(ofstream &out,string filename) {
    ofstream out_gnu;
    ofstream out_arrow;
    ofstream out_forel;
    string arrow_name=filename.substr(0, filename.find_last_of('.')) + "_arrow";
    string filename_gnu = filename.substr(0, filename.find_last_of('.')) + "_gnu.plt";
    string filename_forel = filename.substr(0, filename.find_last_of('.')) + "circle_centres";
    out_gnu.open(filename_gnu);
    out_arrow.open(arrow_name);
    out_forel.open(filename_forel);
    out_gnu << "rgb(r,g,b) = 65536 * int(r) + 256 * int(g) + int(b)" << endl;

    out_gnu << "plot '/Users/AlinaArslanova/untitled1/cmake-build-debug/" + filename +
               "' using 1:2:(rgb($3,$4,$5))  notitle with points lc rgb variable," <<
            " '/Users/AlinaArslanova/untitled1/cmake-build-debug/" + filename_forel + "' with circles";

    out.open(filename);
    //log("printing clusters to " + filename);


    int a, b, c;
    if (!out.is_open()) {
        cout << "Errors in opening" << endl;
    } else {

        for (int i = 0; i < (int) clusters.size(); i++) {
            if (clusters[i].points.size() > 10) {

                Cluster g = clusters[i];
                Point p = g.find_mass_centre();
                vector<double> values = g.find_vectors();
                out_arrow << p.x << " " << p.y << " " << values[0] << " " << values[1] << endl;
                out_arrow << p.x << " " << p.y << " " << values[2] << " " << values[3] << endl;

            }
        }

        for (int i = 0; i < (int) clusters.size(); i++) {

            a = rand() % 257;
            b = rand() % 257;
            c = rand() % 257;
            Cluster g = clusters[i];
            for (int j = 0; j < (int) g.points.size(); j++) {

                out << g.points[j].x << " " << g.points[j].y << " " << a << " " << b << " " << c << " " << endl;
            }


        }
        {

            for (int i = 0; i < (int) forel_circles.size(); i++) {
                Point g = forel_circles[i];
                out_forel << g.x << " " << g.y << " " << forel_r << endl;
            }


        }
        out.close();
        out_arrow.close();
        out_gnu.close();
        out_forel.close();
    }

}